

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITexec.cpp
# Opt level: O0

bool get_jit_file(void)

{
  bool bVar1;
  byte bVar2;
  streamoff sVar3;
  void *pvVar4;
  undefined1 local_2c8 [16];
  int local_2b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0 [4];
  int shcode_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [48];
  string local_220 [8];
  ifstream in;
  char *shcode_origin;
  
  std::ifstream::ifstream(local_220);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          Directory_abi_cxx11_,"");
  if (bVar1) {
    std::operator+(local_250,FileName_abi_cxx11_);
    std::ifstream::open(local_220,(_Ios_Openmode)local_250);
    std::__cxx11::string::~string((string *)local_250);
  }
  else {
    std::operator+(local_2b0,Directory_abi_cxx11_);
    std::operator+(local_290,local_2b0);
    std::operator+(local_270,(char *)local_290);
    std::ifstream::open(local_220,(_Ios_Openmode)local_270);
    std::__cxx11::string::~string((string *)local_270);
    std::__cxx11::string::~string((string *)local_290);
    std::__cxx11::string::~string((string *)local_2b0);
  }
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    shcode_origin._7_1_ = false;
  }
  else {
    std::istream::seekg((long)local_220,_S_beg);
    local_2c8 = std::istream::tellg();
    sVar3 = std::fpos::operator_cast_to_long((fpos *)local_2c8);
    local_2b4 = (int)sVar3;
    pvVar4 = operator_new__((long)local_2b4);
    std::istream::seekg((long)local_220,_S_beg);
    std::istream::read((char *)local_220,(long)pvVar4);
    std::ifstream::close();
    len = *(uint *)((long)pvVar4 + 3);
    code_index = *(uint *)((long)pvVar4 + 7);
    jit_type = *(char *)((long)pvVar4 + 0xb);
    code_bin_end = *(uint *)((long)pvVar4 + 0xc);
    shellcode_begin = (char *)((long)pvVar4 + 0x10);
    if (code_index == registe_ptr->IP) {
      shcode_origin._7_1_ = true;
    }
    else {
      shcode_origin._7_1_ = false;
    }
  }
  std::ifstream::~ifstream(local_220);
  return shcode_origin._7_1_;
}

Assistant:

bool get_jit_file() {
	char *shcode_origin;
	std::ifstream in;
	if(Directory=="") in.open( FileName + ".jit", std::ifstream::in);
	else in.open(Directory+"\\"+FileName+".jit", std::ifstream::in);
	if (in.is_open()) {
		in.seekg(0, std::ios::end);//移到文件尾部
		int shcode_size = in.tellg();//获取文件大小
		shcode_origin = new char[shcode_size];
		in.seekg(0, std::ios::beg);//移到文件头部
		in.read(shcode_origin, shcode_size);
		in.close();
		len = *(unsigned*)(shcode_origin + 3);
		code_index = *(unsigned*)(shcode_origin + 7);
		jit_type = *(shcode_origin + 11);
		code_bin_end= *(unsigned*)(shcode_origin + 12);
		shellcode_begin = shcode_origin + 16;
		if(code_index==registe_ptr->IP)return true;
		else return false;
	}
	else return false;
}